

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O2

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  BIT_CStream_t blockStream;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  
  puVar1 = (ulong *)((long)dst + (dstCapacity - 8));
  pcVar6 = (char *)0xffffffffffffffba;
  if (8 < dstCapacity) {
    blockStream.startPtr = (char *)dst;
    blockStream.endPtr = (char *)puVar1;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateLitLength,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    uVar4 = LL_bits[llCodeTable[nbSeq - 1]];
    uVar14 = (ulong)((uint)sequences[nbSeq - 1].matchLength &
                    BIT_mask[ML_bits[mlCodeTable[nbSeq - 1]]]) << ((byte)uVar4 & 0x3f) |
             (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar4]);
    uVar4 = ML_bits[mlCodeTable[nbSeq - 1]] + uVar4;
    if (longOffsets == 0) {
      uVar14 = (ulong)(BIT_mask[ofCodeTable[nbSeq - 1]] & sequences[nbSeq - 1].offset) <<
               ((byte)uVar4 & 0x3f) | uVar14;
      uVar7 = uVar4 + ofCodeTable[nbSeq - 1];
    }
    else {
      uVar7 = (uint)ofCodeTable[nbSeq - 1];
      puVar9 = (ulong *)dst;
      if (uVar7 < 0x38) {
        uVar5 = sequences[nbSeq - 1].offset;
        bVar11 = 0;
      }
      else {
        uVar13 = 0;
        uVar5 = sequences[nbSeq - 1].offset;
        if (uVar7 != 0x38) {
          uVar13 = (ulong)(uVar7 - 0x38);
          uVar14 = (ulong)(BIT_mask[uVar13] & uVar5) << ((byte)uVar4 & 0x3f) | uVar14;
          uVar4 = (uVar7 + uVar4) - 0x38;
          puVar9 = (ulong *)((ulong)(uVar4 >> 3) + (long)dst);
          if (puVar1 < puVar9) {
            puVar9 = puVar1;
          }
          *(ulong *)dst = uVar14;
          uVar14 = uVar14 >> ((byte)uVar4 & 0x38);
          uVar4 = uVar4 & 7;
        }
        bVar11 = (byte)uVar13;
        uVar7 = 0x38;
      }
      uVar14 = (ulong)(uVar5 >> (bVar11 & 0x1f) & BIT_mask[uVar7]) << ((byte)uVar4 & 0x3f) | uVar14;
      uVar7 = uVar7 + uVar4;
      dst = puVar9;
    }
    *(ulong *)dst = uVar14;
    blockStream.ptr = (char *)((ulong)(uVar7 >> 3) + (long)dst);
    if (puVar1 < blockStream.ptr) {
      blockStream.ptr = (char *)puVar1;
    }
    blockStream.bitContainer = uVar14 >> ((byte)uVar7 & 0x38);
    for (uVar14 = nbSeq - 2; blockStream.bitPos = uVar7 & 7, uVar14 < nbSeq; uVar14 = uVar14 - 1) {
      bVar11 = llCodeTable[uVar14];
      bVar2 = ofCodeTable[uVar14];
      uVar7 = (uint)bVar2;
      bVar3 = mlCodeTable[uVar14];
      uVar4 = LL_bits[bVar11];
      uVar5 = ML_bits[bVar3];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,uVar7);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar3);
      FSE_encodeSymbol(&blockStream,&stateLitLength,(uint)bVar11);
      uVar8 = uVar5 + uVar4 + bVar2;
      uVar12 = blockStream.bitPos;
      if (0x1e < uVar8) {
        *(size_t *)blockStream.ptr = blockStream.bitContainer;
        blockStream.ptr = blockStream.ptr + (blockStream.bitPos >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar12 = blockStream.bitPos & 7;
        blockStream.bitContainer = blockStream.bitContainer >> ((byte)blockStream.bitPos & 0x38);
      }
      uVar13 = (ulong)((uint)sequences[uVar14].matchLength & BIT_mask[uVar5]) <<
               ((byte)(uVar12 + uVar4) & 0x3f) |
               (ulong)((uint)sequences[uVar14].litLength & BIT_mask[uVar4]) << ((byte)uVar12 & 0x3f)
               | blockStream.bitContainer;
      uVar5 = uVar5 + uVar12 + uVar4;
      uVar4 = uVar5;
      if (0x38 < uVar8) {
        *(ulong *)blockStream.ptr = uVar13;
        blockStream.ptr = blockStream.ptr + (uVar5 >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar4 = uVar5 & 7;
        uVar13 = uVar13 >> ((byte)uVar5 & 0x38);
      }
      if (longOffsets == 0) {
        uVar13 = (ulong)(BIT_mask[bVar2] & sequences[uVar14].offset) << ((byte)uVar4 & 0x3f) |
                 uVar13;
        uVar7 = uVar4 + uVar7;
      }
      else {
        if (bVar2 < 0x38) {
          uVar5 = sequences[uVar14].offset;
          bVar11 = 0;
        }
        else {
          uVar10 = 0;
          uVar5 = sequences[uVar14].offset;
          if (uVar7 != 0x38) {
            uVar10 = (ulong)(uVar7 - 0x38);
            uVar13 = (ulong)(BIT_mask[uVar10] & uVar5) << ((byte)uVar4 & 0x3f) | uVar13;
            uVar4 = (uVar4 + uVar7) - 0x38;
            *(ulong *)blockStream.ptr = uVar13;
            blockStream.ptr = blockStream.ptr + (uVar4 >> 3);
            if (blockStream.endPtr < blockStream.ptr) {
              blockStream.ptr = blockStream.endPtr;
            }
            uVar13 = uVar13 >> ((byte)uVar4 & 0x38);
            uVar4 = uVar4 & 7;
          }
          bVar11 = (byte)uVar10;
          uVar7 = 0x38;
        }
        uVar13 = (ulong)(uVar5 >> (bVar11 & 0x1f) & BIT_mask[uVar7]) << ((byte)uVar4 & 0x3f) |
                 uVar13;
        uVar7 = uVar7 + uVar4;
      }
      *(ulong *)blockStream.ptr = uVar13;
      blockStream.ptr = blockStream.ptr + (uVar7 >> 3);
      if (blockStream.endPtr < blockStream.ptr) {
        blockStream.ptr = blockStream.endPtr;
      }
      blockStream.bitContainer = uVar13 >> ((byte)uVar7 & 0x38);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&stateLitLength);
    *(size_t *)blockStream.ptr = blockStream.bitContainer | 1L << ((ulong)blockStream.bitPos & 0x3f)
    ;
    pcVar6 = blockStream.ptr + (blockStream.bitPos + 1 >> 3);
    if (blockStream.endPtr < blockStream.ptr + (blockStream.bitPos + 1 >> 3)) {
      pcVar6 = blockStream.endPtr;
    }
    if ((blockStream.endPtr <= pcVar6) ||
       (pcVar6 = pcVar6 + ((ulong)((blockStream.bitPos + 1 & 7) != 0) - (long)blockStream.startPtr),
       pcVar6 == (char *)0x0)) {
      pcVar6 = (char *)0xffffffffffffffba;
    }
  }
  return (size_t)pcVar6;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}